

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O1

bool __thiscall
beast::detail::LexicalCast<int,_char_*>::operator()
          (LexicalCast<int,_char_*> *this,int *out,char *in)

{
  bool bVar1;
  allocator local_31;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  long local_28;
  long local_20 [2];
  
  std::__cxx11::string::string((string *)&local_30,in,&local_31);
  bVar1 = parseSigned<int,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (out,local_30,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_30._M_current + local_28));
  if ((long *)local_30._M_current != local_20) {
    operator_delete(local_30._M_current,local_20[0] + 1);
  }
  return bVar1;
}

Assistant:

bool operator() (Out& out, char* in) const
    {
        return LexicalCast <Out, std::string>()(out, in);
    }